

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall xscript::parser::ast::predict_type_declarator(ast *this)

{
  bool bVar1;
  ast *this_local;
  
  bVar1 = tokenizer::token::operator==(&this->cur_token,TK_INT);
  if ((((!bVar1) && (bVar1 = tokenizer::token::operator==(&this->cur_token,TK_FLOAT), !bVar1)) &&
      (bVar1 = tokenizer::token::operator==(&this->cur_token,TK_BOOL), !bVar1)) &&
     (((bVar1 = tokenizer::token::operator==(&this->cur_token,TK_STRING), !bVar1 &&
       (bVar1 = tokenizer::token::operator==(&this->cur_token,TK_IDENTIFIER), !bVar1)) &&
      ((bVar1 = tokenizer::token::operator==(&this->cur_token,TK_ARRAY), !bVar1 &&
       (bVar1 = tokenizer::token::operator==(&this->cur_token,TK_MAP), !bVar1)))))) {
    return false;
  }
  return true;
}

Assistant:

bool ast::predict_type_declarator() {
    if (cur_token == tokenizer::TK_INT ||
        cur_token == tokenizer::TK_FLOAT ||
        cur_token == tokenizer::TK_BOOL ||
        cur_token == tokenizer::TK_STRING ||
        cur_token == tokenizer::TK_IDENTIFIER ||
        cur_token == tokenizer::TK_ARRAY ||
        cur_token == tokenizer::TK_MAP
    ) {
        return true;
    }
    return false;
}